

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

bool __thiscall duckdb::Node::MergePrefixes(Node *this,ART *art,Node *other,GateStatus status)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  Node __tmp;
  idx_t iVar4;
  idx_t pos;
  reference<Node> l_node;
  reference<Node> r_node;
  idx_t local_40;
  reference<Node> local_38;
  reference<Node> local_30;
  
  local_40 = 0xffffffffffffffff;
  uVar1 = (this->super_IndexPointer).data;
  local_38._M_data = this;
  local_30._M_data = other;
  if ((uVar1 & 0x7f00000000000000) == 0x100000000000000) {
    uVar2 = (other->super_IndexPointer).data;
    if ((uVar2 & 0x7f00000000000000) == 0x100000000000000) {
      bVar3 = Prefix::Traverse(art,&local_38,&local_30,&local_40,status);
      if (!bVar3) {
        return false;
      }
      iVar4 = local_40;
      if (local_40 == 0xffffffffffffffff) {
        return true;
      }
      goto LAB_01935165;
    }
    (this->super_IndexPointer).data = uVar2;
    (other->super_IndexPointer).data = uVar1;
  }
  iVar4 = 0;
LAB_01935165:
  if (((((local_38._M_data)->super_IndexPointer).data & 0x7f00000000000000) != 0x100000000000000) &&
     (((other->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000)) {
    bVar3 = PrefixContainsOther(local_38._M_data,art,local_38._M_data,other,(uint8_t)iVar4,status);
    return bVar3;
  }
  MergeIntoNode4(local_38._M_data,art,local_38._M_data,other,(uint8_t)iVar4);
  return true;
}

Assistant:

bool Node::MergePrefixes(ART &art, Node &other, const GateStatus status) {
	reference<Node> l_node(*this);
	reference<Node> r_node(other);
	auto pos = DConstants::INVALID_INDEX;

	if (l_node.get().GetType() == NType::PREFIX && r_node.get().GetType() == NType::PREFIX) {
		// Traverse prefixes. Possibly change the referenced nodes.
		if (!Prefix::Traverse(art, l_node, r_node, pos, status)) {
			return false;
		}
		if (pos == DConstants::INVALID_INDEX) {
			return true;
		}

	} else {
		// l_prefix contains r_prefix.
		if (l_node.get().GetType() == NType::PREFIX) {
			swap(*this, other);
		}
		pos = 0;
	}

	D_ASSERT(pos != DConstants::INVALID_INDEX);
	if (l_node.get().GetType() != NType::PREFIX && r_node.get().GetType() == NType::PREFIX) {
		return PrefixContainsOther(art, l_node, r_node, UnsafeNumericCast<uint8_t>(pos), status);
	}

	// The prefixes differ.
	MergeIntoNode4(art, l_node, r_node, UnsafeNumericCast<uint8_t>(pos));
	return true;
}